

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3PoslistCopy(char **pp,char **ppPoslist)

{
  byte *pbVar1;
  byte *__src;
  char *__dest;
  byte bVar2;
  byte bVar3;
  size_t __n;
  byte *pbVar4;
  
  __src = (byte *)*ppPoslist;
  bVar2 = *__src;
  pbVar4 = __src;
  if (bVar2 != 0) {
    do {
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar3 = bVar2 & 0x80;
      bVar2 = *pbVar1;
    } while (bVar3 != 0 || *pbVar1 != 0);
  }
  if (pp != (char **)0x0) {
    __dest = *pp;
    __n = (size_t)((int)(pbVar4 + 1) - (int)__src);
    memcpy(__dest,__src,__n);
    *pp = __dest + __n;
  }
  *ppPoslist = (char *)(pbVar4 + 1);
  return;
}

Assistant:

static void fts3PoslistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* The end of a position list is marked by a zero encoded as an FTS3
  ** varint. A single POS_END (0) byte. Except, if the 0 byte is preceded by
  ** a byte with the 0x80 bit set, then it is not a varint 0, but the tail
  ** of some other, multi-byte, value.
  **
  ** The following while-loop moves pEnd to point to the first byte that is not
  ** immediately preceded by a byte with the 0x80 bit set. Then increments
  ** pEnd once more so that it points to the byte immediately following the
  ** last byte in the position-list.
  */
  while( *pEnd | c ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && (*pEnd)==0 );
  }
  pEnd++;  /* Advance past the POS_END terminator byte */

  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}